

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

Curl_dns_entry * fetch_addr(connectdata *conn,char *hostname,int port)

{
  Curl_easy *data_00;
  int iVar1;
  long local_158;
  hostcache_prune_data user;
  char entry_id [262];
  Curl_easy *data;
  size_t entry_len;
  Curl_dns_entry *dns;
  int port_local;
  char *hostname_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  create_hostcache_id(hostname,port,(char *)&user.now,0x106);
  data = (Curl_easy *)strlen((char *)&user.now);
  entry_len = (size_t)Curl_hash_pick((data_00->dns).hostcache,&user.now,
                                     (size_t)((long)&data->next + 1));
  if (((void *)entry_len == (void *)0x0) && (((byte)(data_00->change).field_0x20 >> 2 & 1) != 0)) {
    create_hostcache_id("*",port,(char *)&user.now,0x106);
    data = (Curl_easy *)strlen((char *)&user.now);
    entry_len = (size_t)Curl_hash_pick((data_00->dns).hostcache,&user.now,
                                       (size_t)((long)&data->next + 1));
  }
  if ((entry_len != 0) && ((data_00->set).dns_cache_timeout != -1)) {
    time(&user.cache_timeout);
    local_158 = (data_00->set).dns_cache_timeout;
    iVar1 = hostcache_timestamp_remove(&local_158,(void *)entry_len);
    if (iVar1 != 0) {
      Curl_infof(data_00,"Hostname in DNS cache was stale, zapped\n");
      entry_len = 0;
      Curl_hash_delete((data_00->dns).hostcache,&user.now,(size_t)((long)&data->next + 1));
    }
  }
  return (Curl_dns_entry *)entry_len;
}

Assistant:

static struct Curl_dns_entry *
fetch_addr(struct connectdata *conn,
                const char *hostname,
                int port)
{
  struct Curl_dns_entry *dns = NULL;
  size_t entry_len;
  struct Curl_easy *data = conn->data;
  char entry_id[MAX_HOSTCACHE_LEN];

  /* Create an entry id, based upon the hostname and port */
  create_hostcache_id(hostname, port, entry_id, sizeof(entry_id));
  entry_len = strlen(entry_id);

  /* See if its already in our dns cache */
  dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

  /* No entry found in cache, check if we might have a wildcard entry */
  if(!dns && data->change.wildcard_resolve) {
    create_hostcache_id("*", port, entry_id, sizeof(entry_id));
    entry_len = strlen(entry_id);

    /* See if it's already in our dns cache */
    dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);
  }

  if(dns && (data->set.dns_cache_timeout != -1)) {
    /* See whether the returned entry is stale. Done before we release lock */
    struct hostcache_prune_data user;

    time(&user.now);
    user.cache_timeout = data->set.dns_cache_timeout;

    if(hostcache_timestamp_remove(&user, dns)) {
      infof(data, "Hostname in DNS cache was stale, zapped\n");
      dns = NULL; /* the memory deallocation is being handled by the hash */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
    }
  }

  return dns;
}